

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

size_t secp256k1_scratch_max_allocation
                 (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t objects)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  secp256k1_callback *psVar8;
  secp256k1_callback *psVar7;
  
  lVar4 = 0;
  psVar7 = error_callback;
  do {
    psVar8 = (secp256k1_callback *)((ulong)psVar7 & 0xffffffff);
    bVar1 = scratch->magic[lVar4];
    bVar2 = "scratch"[lVar4];
    psVar7 = (secp256k1_callback *)(ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      psVar7 = psVar8;
    }
    iVar6 = (int)psVar7;
    if (bVar1 != bVar2) goto LAB_00136ae8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  iVar6 = 0;
LAB_00136ae8:
  if (iVar6 != 0) {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    return 0;
  }
  uVar5 = scratch->max_size - scratch->alloc_size;
  sVar3 = 0;
  if (objects * 0xf <= uVar5) {
    sVar3 = uVar5 + objects * -0xf;
  }
  return sVar3;
}

Assistant:

static size_t secp256k1_scratch_max_allocation(const secp256k1_callback* error_callback, const secp256k1_scratch* scratch, size_t objects) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return 0;
    }
    /* Ensure that multiplication will not wrap around */
    if (ALIGNMENT > 1 && objects > SIZE_MAX/(ALIGNMENT - 1)) {
        return 0;
    }
    if (scratch->max_size - scratch->alloc_size <= objects * (ALIGNMENT - 1)) {
        return 0;
    }
    return scratch->max_size - scratch->alloc_size - objects * (ALIGNMENT - 1);
}